

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
mxx::allgatherv<std::pair<int,int>>
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,mxx *this,pair<int,_int> *data,size_t size,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,comm *comm)

{
  long *plVar1;
  size_type __n;
  allocator_type local_29;
  
  __n = 0;
  for (plVar1 = *(long **)size; plVar1 != *(long **)(size + 8); plVar1 = plVar1 + 1) {
    __n = __n + *plVar1;
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (__return_storage_ptr__,__n,&local_29);
  allgatherv<std::pair<int,int>>
            ((pair<int,_int> *)this,(size_t)data,
             (__return_storage_ptr__->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)size,(comm *)recv_sizes);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> allgatherv(const T* data, size_t size, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    size_t total_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), static_cast<size_t>(0));
    std::vector<T> result(total_size);
    allgatherv(data, size, &result[0], recv_sizes, comm);
    return result;
}